

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbox_base.cpp
# Opt level: O0

void __thiscall cppurses::detail::Textbox_base::scroll_up(Textbox_base *this,size_t n)

{
  Point position;
  size_t sVar1;
  size_t local_20;
  size_t y;
  size_t n_local;
  Textbox_base *this_local;
  
  sVar1 = Text_display::top_line(&this->super_Text_display);
  if (sVar1 != 0) {
    Text_display::scroll_up(&this->super_Text_display,n);
    sVar1 = Cursor_data::y(&(this->super_Text_display).super_Widget.cursor);
    local_20 = sVar1 + n;
    sVar1 = Widget::height((Widget *)this);
    if (sVar1 - 1 < local_20) {
      sVar1 = Widget::height((Widget *)this);
      local_20 = sVar1 - 1;
    }
    sVar1 = Cursor_data::x(&(this->super_Text_display).super_Widget.cursor);
    position.y = local_20;
    position.x = sVar1;
    set_cursor(this,position);
  }
  return;
}

Assistant:

void Textbox_base::scroll_up(std::size_t n) {
    if (this->top_line() == 0) {
        return;
    }
    Text_display::scroll_up(n);
    auto y = this->cursor.y() + n;
    if (y > this->height() - 1) {
        y = this->height() - 1;
    }
    this->set_cursor({this->cursor.x(), y});
}